

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_448ecb::NewExpr::printLeft(NewExpr *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  Node *pNVar3;
  
  if (this->IsGlobal == true) {
    OutputStream::grow(S,0xb);
    builtin_strncpy(S->Buffer + S->CurrentPosition,"::operator ",0xb);
    S->CurrentPosition = S->CurrentPosition + 0xb;
  }
  OutputStream::grow(S,3);
  pcVar1 = S->Buffer;
  sVar2 = S->CurrentPosition;
  pcVar1[sVar2 + 2] = 'w';
  pcVar1 = pcVar1 + sVar2;
  pcVar1[0] = 'n';
  pcVar1[1] = 'e';
  S->CurrentPosition = S->CurrentPosition + 3;
  if (this->IsArray == true) {
    OutputStream::grow(S,2);
    pcVar1 = S->Buffer;
    sVar2 = S->CurrentPosition;
    (pcVar1 + sVar2)[0] = '[';
    (pcVar1 + sVar2)[1] = ']';
    S->CurrentPosition = S->CurrentPosition + 2;
  }
  OutputStream::grow(S,1);
  sVar2 = S->CurrentPosition;
  S->CurrentPosition = sVar2 + 1;
  S->Buffer[sVar2] = ' ';
  if ((this->ExprList).NumElements != 0) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = '(';
    S->CurrentPosition = S->CurrentPosition + 1;
    NodeArray::printWithComma(&this->ExprList,S);
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ')';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  pNVar3 = this->Type;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache != No) {
    (*pNVar3->_vptr_Node[5])(pNVar3,S);
  }
  if ((this->InitList).NumElements != 0) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = '(';
    S->CurrentPosition = S->CurrentPosition + 1;
    NodeArray::printWithComma(&this->InitList,S);
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ')';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsGlobal)
      S += "::operator ";
    S += "new";
    if (IsArray)
      S += "[]";
    S += ' ';
    if (!ExprList.empty()) {
      S += "(";
      ExprList.printWithComma(S);
      S += ")";
    }
    Type->print(S);
    if (!InitList.empty()) {
      S += "(";
      InitList.printWithComma(S);
      S += ")";
    }

  }